

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Mac::SublimeMergeReporter::SublimeMergeReporter(SublimeMergeReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Mac::SUBLIME_MERGE();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__SublimeMergeReporter_001c1d80;
  SystemLauncher::setForeground((SystemLauncher *)((long)&in_RDI[1].program.field_2 + 8),true);
  return;
}

Assistant:

SublimeMergeReporter::SublimeMergeReporter()
            : GenericDiffReporter(DiffPrograms::Mac::SUBLIME_MERGE())
        {
            launcher.setForeground(true);
        }